

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O2

Float __thiscall pbrt::SummedAreaTable::LookupInt(SummedAreaTable *this,int x,int y)

{
  int x_00;
  double *pdVar1;
  int y_00;
  float fVar2;
  
  fVar2 = 0.0;
  if (y != 0 && x != 0) {
    x_00 = ~(this->sum).extent.pMin.super_Tuple2<pbrt::Point2,_int>.x +
           (this->sum).extent.pMax.super_Tuple2<pbrt::Point2,_int>.x;
    if (x + -1 <= x_00) {
      x_00 = x + -1;
    }
    y_00 = ~(this->sum).extent.pMin.super_Tuple2<pbrt::Point2,_int>.y +
           (this->sum).extent.pMax.super_Tuple2<pbrt::Point2,_int>.y;
    if (y + -1 <= y_00) {
      y_00 = y + -1;
    }
    pdVar1 = Array2D<double>::operator()(&this->sum,x_00,y_00);
    fVar2 = (float)*pdVar1;
  }
  return fVar2;
}

Assistant:

PBRT_CPU_GPU
    Float LookupInt(int x, int y) const {
        // Return zero at lower boundaries
        if (x == 0 || y == 0)
            return 0;

        // Reindex $(x,y)$ and return actual stored value
        x = std::min(x - 1, sum.xSize() - 1);
        y = std::min(y - 1, sum.ySize() - 1);
        return sum(x, y);
    }